

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphps(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  int *in_R8;
  int extend;
  long gcount;
  long pcount;
  int simple;
  LONGLONG in_stack_00000070;
  long *in_stack_00000078;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  fitsfile *in_stack_00000090;
  LONGLONG in_stack_000000a0;
  int in_stack_000000a8;
  int *in_stack_000000b0;
  
  ffphpr(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000084,in_stack_00000078,
         in_stack_00000070,in_stack_000000a0,in_stack_000000a8,in_stack_000000b0);
  return *in_R8;
}

Assistant:

int ffphps( fitsfile *fptr, /* I - FITS file pointer                        */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            long naxes[],   /* I - length of each data axis                 */
            int *status)    /* IO - error status                            */
/*
  write STANDARD set of required primary header keywords
*/
{
    int simple = 1;     /* does file conform to FITS standard? 1/0  */
    long pcount = 0;    /* number of group parameters (usually 0)   */
    long gcount = 1;    /* number of random groups (usually 1 or 0) */
    int extend = 1;     /* may FITS file have extensions?           */

    ffphpr(fptr, simple, bitpix, naxis, naxes, pcount, gcount, extend, status);
    return(*status);
}